

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  int iVar1;
  undefined1 local_58 [8];
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  int ret;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,0);
  if (iVar1 == 0) {
    grp_local._4_4_ = 0;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)&ZZi.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_58);
    Zi.p._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&ZZi.p,&pt->Z,&grp->P);
    if (((Zi.p._4_4_ == 0) &&
        (Zi.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_58,(mbedtls_mpi *)&ZZi.p,
                                          (mbedtls_mpi *)&ZZi.p), Zi.p._4_4_ == 0)) &&
       (Zi.p._4_4_ = ecp_modp((mbedtls_mpi *)local_58,grp), Zi.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      Zi.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->X,&pt->X,(mbedtls_mpi *)local_58);
      if ((Zi.p._4_4_ == 0) && (Zi.p._4_4_ = ecp_modp(&pt->X,grp), Zi.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        Zi.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->Y,&pt->Y,(mbedtls_mpi *)local_58);
        if ((Zi.p._4_4_ == 0) && (Zi.p._4_4_ = ecp_modp(&pt->Y,grp), Zi.p._4_4_ == 0)) {
          mul_count = mul_count + 1;
          Zi.p._4_4_ = mbedtls_mpi_mul_mpi(&pt->Y,&pt->Y,(mbedtls_mpi *)&ZZi.p);
          if ((Zi.p._4_4_ == 0) && (Zi.p._4_4_ = ecp_modp(&pt->Y,grp), Zi.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
            Zi.p._4_4_ = mbedtls_mpi_lset(&pt->Z,1);
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)&ZZi.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_58);
    grp_local._4_4_ = Zi.p._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt )
{
    int ret;
    mbedtls_mpi Zi, ZZi;

    if( mbedtls_mpi_cmp_int( &pt->Z, 0 ) == 0 )
        return( 0 );

    mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * X = X / Z^2  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &Zi,      &pt->Z,     &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ZZi,     &Zi,        &Zi     ) ); MOD_MUL( ZZi );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->X,   &pt->X,     &ZZi    ) ); MOD_MUL( pt->X );

    /*
     * Y = Y / Z^3  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Y,   &pt->Y,     &ZZi    ) ); MOD_MUL( pt->Y );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Y,   &pt->Y,     &Zi     ) ); MOD_MUL( pt->Y );

    /*
     * Z = 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:

    mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );

    return( ret );
}